

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  ulong uVar1;
  WhereLevel *pWVar2;
  byte bVar3;
  u8 uVar4;
  int iVar5;
  Parse *pParse;
  SrcList *pTabList;
  sqlite3 *db;
  Vdbe *v;
  WhereRightJoin *pWVar6;
  WhereLoop *pWVar7;
  Index *pIVar8;
  Table *pTab;
  IndexedExpr *pIVar9;
  char cVar10;
  ushort uVar11;
  int iVar12;
  int iVar13;
  anon_union_16_2_b76807be_for_u *paVar14;
  Index *pIVar15;
  int i;
  long lVar16;
  long lVar17;
  IndexedExpr **ppIVar18;
  WhereRightJoin *pRJ;
  ulong uVar19;
  Op *pOVar20;
  uint uVar21;
  WhereLevel *pLevel;
  i16 iCol;
  uint uVar22;
  u8 *puVar23;
  Op *pOVar24;
  
  pParse = pWInfo->pParse;
  pTabList = pWInfo->pTabList;
  db = pParse->db;
  v = pParse->pVdbe;
  iVar5 = v->nOp;
  pLevel = pWInfo->a;
  cVar10 = '\0';
  uVar19 = (ulong)pWInfo->nLevel;
  while (0 < (long)uVar19) {
    uVar1 = uVar19 - 1;
    pWVar2 = pLevel + uVar1;
    pWVar6 = pWInfo->a[uVar19 - 1].pRJ;
    if (pWVar6 != (WhereRightJoin *)0x0) {
      sqlite3VdbeResolveLabel(v,pWVar2->addrCont);
      pWVar2->addrCont = 0;
      pWVar6->endSubrtn = v->nOp;
      sqlite3VdbeAddOp3(v,0x43,pWVar6->regReturn,pWVar6->addrSubrtn,1);
      cVar10 = cVar10 + '\x01';
    }
    pWVar7 = pWVar2->pWLoop;
    if (pWVar2->op == 0xbb) {
      if (pWVar2->addrCont != 0) {
        sqlite3VdbeResolveLabel(v,pWVar2->addrCont);
      }
    }
    else {
      iVar13 = 0;
      iVar12 = 0;
      if ((((pWInfo->eDistinct == '\x02') && (iVar12 = iVar13, uVar19 == pWInfo->nLevel)) &&
          ((pWVar7->wsFlags & 0x200) != 0)) &&
         (pIVar8 = (pWVar7->u).btree.pIndex, (pIVar8->field_0x63 & 0x80) != 0)) {
        uVar11 = (pWVar7->u).btree.nDistinctCol;
        if ((uVar11 != 0) && (uVar21 = (uint)uVar11, 0x23 < pIVar8->aiRowLogEst[uVar11])) {
          iVar12 = pParse->nMem + 1;
          for (uVar22 = 0; uVar21 != uVar22; uVar22 = uVar22 + 1) {
            sqlite3VdbeAddOp3(v,0x5e,pWVar2->iIdxCur,uVar22,iVar12 + uVar22);
          }
          pParse->nMem = pParse->nMem + uVar21 + 1;
          iVar12 = sqlite3VdbeAddOp4Int
                             (v,(uint)(pWVar2->op != '&') * 3 + 0x15,pWVar2->iIdxCur,0,iVar12,uVar21
                             );
          sqlite3VdbeAddOp2(v,9,1,pWVar2->p2);
        }
      }
      if (pWVar2->addrCont != 0) {
        sqlite3VdbeResolveLabel(v,pWVar2->addrCont);
      }
      sqlite3VdbeAddOp3(v,(uint)pWVar2->op,pWVar2->p1,pWVar2->p2,(uint)pWVar2->p3);
      if (0 < (long)v->nOp) {
        v->aOp[(long)v->nOp + -1].p5 = (ushort)pWVar2->p5;
      }
      if (pWVar2->regBignull != 0) {
        sqlite3VdbeResolveLabel(v,pWVar2->addrBignull);
        sqlite3VdbeAddOp2(v,0x3d,pWVar2->regBignull,pWVar2->p2 + -1);
      }
      if (iVar12 != 0) {
        sqlite3VdbeJumpHere(v,iVar12);
      }
    }
    if (((pWVar7->wsFlags & 0x800) != 0) && (0 < (pWVar2->u).in.nIn)) {
      sqlite3VdbeResolveLabel(v,pWVar2->addrNxt);
      uVar19 = (ulong)(pWVar2->u).in.nIn;
      puVar23 = &(pWVar2->u).in.aInLoop[uVar19 - 1].eEndLoopOp;
      for (; 0 < (int)uVar19; uVar19 = (ulong)((int)uVar19 - 1)) {
        sqlite3VdbeJumpHere(v,*(int *)(puVar23 + -0xc) + 1);
        if (*puVar23 != 0xbb) {
          if (*(int *)(puVar23 + -4) != 0) {
            uVar21 = pWVar7->wsFlags & 0x40400;
            if (pWVar2->iLeftJoin != 0) {
              sqlite3VdbeAddOp2(v,0x19,((InLoop *)(puVar23 + -0x10))->iCur,
                                v->nOp + 2 + (uint)(uVar21 == 0x40000));
            }
            if (uVar21 == 0x40000) {
              sqlite3VdbeAddOp4Int
                        (v,0x1a,pWVar2->iIdxCur,v->nOp + 2,*(int *)(puVar23 + -8),
                         *(int *)(puVar23 + -4));
              sqlite3VdbeJumpHere(v,*(int *)(puVar23 + -0xc) + 1);
            }
          }
          sqlite3VdbeAddOp2(v,(uint)*puVar23,((InLoop *)(puVar23 + -0x10))->iCur,
                            *(int *)(puVar23 + -0xc));
        }
        sqlite3VdbeJumpHere(v,*(int *)(puVar23 + -0xc) + -1);
        puVar23 = puVar23 + -0x14;
      }
    }
    sqlite3VdbeResolveLabel(v,pWVar2->addrBrk);
    if (pWVar2->pRJ != (WhereRightJoin *)0x0) {
      sqlite3VdbeAddOp3(v,0x43,pWVar2->pRJ->regReturn,0,1);
    }
    if (pWVar2->addrSkip != 0) {
      sqlite3VdbeGoto(v,pWVar2->addrSkip);
      sqlite3VdbeJumpHere(v,pWVar2->addrSkip);
      sqlite3VdbeJumpHere(v,pWVar2->addrSkip + -2);
    }
    if (pWVar2->addrLikeRep != 0) {
      sqlite3VdbeAddOp2(v,0x3d,pWVar2->iLikeRepCntr >> 1,pWVar2->addrLikeRep);
    }
    uVar19 = uVar1;
    if (pWVar2->iLeftJoin != 0) {
      uVar21 = pWVar7->wsFlags;
      iVar12 = sqlite3VdbeAddOp1(v,0x32,pWVar2->iLeftJoin);
      if ((uVar21 & 0x40) == 0) {
        bVar3 = pWVar2->iFrom;
        if ((pTabList->a[bVar3].fg.field_0x1 & 0x40) != 0) {
          iVar13 = (pTabList->a[bVar3].u4.pSubq)->regResult;
          sqlite3VdbeAddOp3(v,0x4b,0,iVar13,iVar13 + -1 + (int)(pTabList->a[bVar3].pSTab)->nCol);
        }
        sqlite3VdbeAddOp1(v,0x88,pWVar2->iTabCur);
      }
      if ((uVar21 >> 9 & 1) == 0) {
        if (((uVar21 >> 0xd & 1) != 0) && ((pWVar2->u).pCoveringIdx != (Index *)0x0)) {
LAB_001840dd:
          pIVar8 = (pWVar2->u).pCoveringIdx;
          iVar13 = sqlite3SchemaToIndex(db,pIVar8->pSchema);
          sqlite3VdbeAddOp3(v,0x65,pWVar2->iIdxCur,pIVar8->tnum,iVar13);
          sqlite3VdbeSetP4KeyInfo(pParse,pIVar8);
          goto LAB_00184111;
        }
      }
      else {
        if ((uVar21 >> 0xd & 1) != 0) goto LAB_001840dd;
LAB_00184111:
        sqlite3VdbeAddOp1(v,0x88,pWVar2->iIdxCur);
      }
      if (pWVar2->op == 'C') {
        sqlite3VdbeAddOp2(v,10,pWVar2->p1,pWVar2->addrFirst);
      }
      else {
        sqlite3VdbeGoto(v,pWVar2->addrFirst);
      }
      sqlite3VdbeJumpHere(v,iVar12);
    }
  }
  uVar21 = 0;
  do {
    if (pWInfo->nLevel <= uVar21) {
      sqlite3VdbeResolveLabel(v,pWInfo->iBreak);
      pParse->nQueryLoop = (LogEst)pWInfo->savedNQueryLoop;
      whereInfoFree(db,pWInfo);
      pParse->withinRJSubrtn = pParse->withinRJSubrtn - cVar10;
      return;
    }
    if (pLevel->pRJ == (WhereRightJoin *)0x0) {
      bVar3 = pLevel->iFrom;
      if ((pTabList->a[bVar3].fg.field_0x1 & 0x40) == 0) {
        pTab = pTabList->a[bVar3].pSTab;
        pWVar7 = pLevel->pWLoop;
        if ((pWVar7->wsFlags & 0x240) == 0) {
          if ((pWVar7->wsFlags >> 0xd & 1) == 0) goto LAB_001841f6;
          paVar14 = &pLevel->u;
        }
        else {
          paVar14 = (anon_union_16_2_b76807be_for_u *)&(pWVar7->u).btree.pIndex;
        }
        pIVar8 = paVar14->pCoveringIdx;
        if ((pIVar8 != (Index *)0x0) && (db->mallocFailed == '\0')) {
          iVar12 = iVar5;
          if ((pWInfo->eOnePass != '\0') && ((pIVar8->pTable->tabFlags & 0x80) == 0)) {
            iVar12 = pWInfo->iEndWhere;
          }
          ppIVar18 = &pParse->pIdxEpr;
          if ((pIVar8->field_0x64 & 0x10) != 0) {
            while (pIVar9 = *ppIVar18, pIVar9 != (IndexedExpr *)0x0) {
              if (pIVar9->iIdxCur == pLevel->iIdxCur) {
                pIVar9->iDataCur = -1;
                pIVar9->iIdxCur = -1;
              }
              ppIVar18 = &pIVar9->pIENext;
            }
          }
          lVar16 = (long)pLevel->addrBody + 1;
          pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (v->db->mallocFailed == '\0') {
            pOVar20 = v->aOp + lVar16;
          }
          pOVar24 = pOVar20 + (iVar12 - (int)lVar16);
          do {
            if (pOVar20->p1 == pLevel->iTabCur) {
              uVar4 = pOVar20->opcode;
              if (uVar4 == '\x14') {
                pOVar20->p1 = pLevel->iIdxCur;
              }
              else if (uVar4 == 0x87) {
                pOVar20->p1 = pLevel->iIdxCur;
                pOVar20->opcode = 0x8e;
              }
              else if (uVar4 == '^') {
                uVar19 = (ulong)pOVar20->p2;
                if ((char)pTab->tabFlags < '\0') {
                  pIVar15 = sqlite3PrimaryKeyIndex(pTab);
                  iCol = pIVar15->aiColumn[uVar19];
                }
                else {
                  if ((pTab->tabFlags & 0x20) != 0) {
                    lVar16 = 0xe;
                    for (lVar17 = 0; lVar17 <= (short)uVar19; lVar17 = lVar17 + 1) {
                      uVar19 = (ulong)(ushort)((short)uVar19 +
                                              (ushort)((*(ushort *)
                                                         ((long)&pTab->aCol->zCnName + lVar16) >> 5
                                                       & 1) != 0));
                      lVar16 = lVar16 + 0x10;
                    }
                  }
                  iCol = (i16)uVar19;
                }
                uVar11 = sqlite3TableColumnToIndex(pIVar8,iCol);
                if ((short)uVar11 < 0) {
                  uVar22 = pWVar7->wsFlags;
                  if ((uVar22 & 0x4000040) != 0) {
                    if ((uVar22 & 0x40) == 0) {
                      pWVar7->wsFlags = uVar22 & 0xfbffffbf;
                      sqlite3WhereAddExplainText
                                (pParse,pLevel->addrBody + -1,pTabList,pLevel,pWInfo->wctrlFlags);
                    }
                    else {
                      sqlite3ErrorMsg(pParse,"internal query planner error");
                      pParse->rc = 2;
                    }
                  }
                }
                else {
                  pOVar20->p2 = (uint)uVar11;
                  pOVar20->p1 = pLevel->iIdxCur;
                }
              }
            }
            pOVar20 = pOVar20 + 1;
          } while (pOVar20 < pOVar24);
        }
      }
      else {
        translateColumnToCopy
                  (pParse,pLevel->addrBody,pLevel->iTabCur,(pTabList->a[bVar3].u4.pSubq)->regResult,
                   0);
      }
    }
    else {
      sqlite3WhereRightJoinLoop(pWInfo,uVar21,pLevel);
    }
LAB_001841f6:
    uVar21 = uVar21 + 1;
    pLevel = pLevel + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  WhereLoop *pLoop;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;
  int iEnd = sqlite3VdbeCurrentAddr(v);
  int nRJ = 0;

  /* Generate loop termination code.
  */
  VdbeModuleComment((v, "End WHERE-core"));
  for(i=pWInfo->nLevel-1; i>=0; i--){
    int addr;
    pLevel = &pWInfo->a[i];
    if( pLevel->pRJ ){
      /* Terminate the subroutine that forms the interior of the loop of
      ** the RIGHT JOIN table */
      WhereRightJoin *pRJ = pLevel->pRJ;
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      pLevel->addrCont = 0;
      pRJ->endSubrtn = sqlite3VdbeCurrentAddr(v);
      sqlite3VdbeAddOp3(v, OP_Return, pRJ->regReturn, pRJ->addrSubrtn, 1);
      VdbeCoverage(v);
      nRJ++;
    }
    pLoop = pLevel->pWLoop;
    if( pLevel->op!=OP_Noop ){
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      int addrSeek = 0;
      Index *pIdx;
      int n;
      if( pWInfo->eDistinct==WHERE_DISTINCT_ORDERED
       && i==pWInfo->nLevel-1  /* Ticket [ef9318757b152e3] 2017-10-21 */
       && (pLoop->wsFlags & WHERE_INDEXED)!=0
       && (pIdx = pLoop->u.btree.pIndex)->hasStat1
       && (n = pLoop->u.btree.nDistinctCol)>0
       && pIdx->aiRowLogEst[n]>=36
      ){
        int r1 = pParse->nMem+1;
        int j, op;
        for(j=0; j<n; j++){
          sqlite3VdbeAddOp3(v, OP_Column, pLevel->iIdxCur, j, r1+j);
        }
        pParse->nMem += n+1;
        op = pLevel->op==OP_Prev ? OP_SeekLT : OP_SeekGT;
        addrSeek = sqlite3VdbeAddOp4Int(v, op, pLevel->iIdxCur, 0, r1, n);
        VdbeCoverageIf(v, op==OP_SeekLT);
        VdbeCoverageIf(v, op==OP_SeekGT);
        sqlite3VdbeAddOp2(v, OP_Goto, 1, pLevel->p2);
      }
#endif /* SQLITE_DISABLE_SKIPAHEAD_DISTINCT */
      /* The common case: Advance to the next row */
      if( pLevel->addrCont ) sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      sqlite3VdbeAddOp3(v, pLevel->op, pLevel->p1, pLevel->p2, pLevel->p3);
      sqlite3VdbeChangeP5(v, pLevel->p5);
      VdbeCoverage(v);
      VdbeCoverageIf(v, pLevel->op==OP_Next);
      VdbeCoverageIf(v, pLevel->op==OP_Prev);
      VdbeCoverageIf(v, pLevel->op==OP_VNext);
      if( pLevel->regBignull ){
        sqlite3VdbeResolveLabel(v, pLevel->addrBignull);
        sqlite3VdbeAddOp2(v, OP_DecrJumpZero, pLevel->regBignull, pLevel->p2-1);
        VdbeCoverage(v);
      }
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      if( addrSeek ) sqlite3VdbeJumpHere(v, addrSeek);
#endif
    }else if( pLevel->addrCont ){
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    }
    if( (pLoop->wsFlags & WHERE_IN_ABLE)!=0 && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        assert( sqlite3VdbeGetOp(v, pIn->addrInTop+1)->opcode==OP_IsNull
                 || pParse->db->mallocFailed );
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        if( pIn->eEndLoopOp!=OP_Noop ){
          if( pIn->nPrefix ){
            int bEarlyOut =
                (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
                 && (pLoop->wsFlags & WHERE_IN_EARLYOUT)!=0;
            if( pLevel->iLeftJoin ){
              /* For LEFT JOIN queries, cursor pIn->iCur may not have been
              ** opened yet. This occurs for WHERE clauses such as
              ** "a = ? AND b IN (...)", where the index is on (a, b). If
              ** the RHS of the (a=?) is NULL, then the "b IN (...)" may
              ** never have been coded, but the body of the loop run to
              ** return the null-row. So, if the cursor is not open yet,
              ** jump over the OP_Next or OP_Prev instruction about to
              ** be coded.  */
              sqlite3VdbeAddOp2(v, OP_IfNotOpen, pIn->iCur,
                  sqlite3VdbeCurrentAddr(v) + 2 + bEarlyOut);
              VdbeCoverage(v);
            }
            if( bEarlyOut ){
              sqlite3VdbeAddOp4Int(v, OP_IfNoHope, pLevel->iIdxCur,
                  sqlite3VdbeCurrentAddr(v)+2,
                  pIn->iBase, pIn->nPrefix);
              VdbeCoverage(v);
              /* Retarget the OP_IsNull against the left operand of IN so
              ** it jumps past the OP_IfNoHope.  This is because the
              ** OP_IsNull also bypasses the OP_Affinity opcode that is
              ** required by OP_IfNoHope. */
              sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
            }
          }
          sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
          VdbeCoverage(v);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Prev);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Next);
        }
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->pRJ ){
      sqlite3VdbeAddOp3(v, OP_Return, pLevel->pRJ->regReturn, 0, 1);
      VdbeCoverage(v);
    }
    if( pLevel->addrSkip ){
      sqlite3VdbeGoto(v, pLevel->addrSkip);
      VdbeComment((v, "next skip-scan on %s", pLoop->u.btree.pIndex->zName));
      sqlite3VdbeJumpHere(v, pLevel->addrSkip);
      sqlite3VdbeJumpHere(v, pLevel->addrSkip-2);
    }
#ifndef SQLITE_LIKE_DOESNT_MATCH_BLOBS
    if( pLevel->addrLikeRep ){
      sqlite3VdbeAddOp2(v, OP_DecrJumpZero, (int)(pLevel->iLikeRepCntr>>1),
                        pLevel->addrLikeRep);
      VdbeCoverage(v);
    }
#endif
    if( pLevel->iLeftJoin ){
      int ws = pLoop->wsFlags;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin); VdbeCoverage(v);
      assert( (ws & WHERE_IDX_ONLY)==0 || (ws & WHERE_INDEXED)!=0 );
      if( (ws & WHERE_IDX_ONLY)==0 ){
        SrcItem *pSrc = &pTabList->a[pLevel->iFrom];
        assert( pLevel->iTabCur==pSrc->iCursor );
        if( pSrc->fg.viaCoroutine ){
          int m, n;
          assert( pSrc->fg.isSubquery );
          n = pSrc->u4.pSubq->regResult;
          assert( pSrc->pSTab!=0 );
          m = pSrc->pSTab->nCol;
          sqlite3VdbeAddOp3(v, OP_Null, 0, n, n+m-1);
        }
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iTabCur);
      }
      if( (ws & WHERE_INDEXED)
       || ((ws & WHERE_MULTI_OR) && pLevel->u.pCoveringIdx)
      ){
        if( ws & WHERE_MULTI_OR ){
          Index *pIx = pLevel->u.pCoveringIdx;
          int iDb = sqlite3SchemaToIndex(db, pIx->pSchema);
          sqlite3VdbeAddOp3(v, OP_ReopenIdx, pLevel->iIdxCur, pIx->tnum, iDb);
          sqlite3VdbeSetP4KeyInfo(pParse, pIx);
        }
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeGoto(v, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
    VdbeModuleComment((v, "End WHERE-loop%d: %s", i,
                     pWInfo->pTabList->a[pLevel->iFrom].pSTab->zName));
  }

  assert( pWInfo->nLevel<=pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    int k, last;
    VdbeOp *pOp, *pLastOp;
    Index *pIdx = 0;
    SrcItem *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pSTab;
    assert( pTab!=0 );
    pLoop = pLevel->pWLoop;

    /* Do RIGHT JOIN processing.  Generate code that will output the
    ** unmatched rows of the right operand of the RIGHT JOIN with
    ** all of the columns of the left operand set to NULL.
    */
    if( pLevel->pRJ ){
      sqlite3WhereRightJoinLoop(pWInfo, i, pLevel);
      continue;
    }

    /* For a co-routine, change all OP_Column references to the table of
    ** the co-routine into OP_Copy of result contained in a register.
    ** OP_Rowid becomes OP_Null.
    */
    if( pTabItem->fg.viaCoroutine ){
      testcase( pParse->db->mallocFailed );
      assert( pTabItem->fg.isSubquery );
      assert( pTabItem->u4.pSubq->regResult>=0 );
      translateColumnToCopy(pParse, pLevel->addrBody, pLevel->iTabCur,
                            pTabItem->u4.pSubq->regResult, 0);
      continue;
    }

    /* If this scan uses an index, make VDBE code substitutions to read data
    ** from the index instead of from the table where possible.  In some cases
    ** this optimization prevents the table from ever being read, which can
    ** yield a significant performance boost.
    **
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLoop->wsFlags & (WHERE_INDEXED|WHERE_IDX_ONLY) ){
      pIdx = pLoop->u.btree.pIndex;
    }else if( pLoop->wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCoveringIdx;
    }
    if( pIdx
     && !db->mallocFailed
    ){
      if( pWInfo->eOnePass==ONEPASS_OFF || !HasRowid(pIdx->pTable) ){
        last = iEnd;
      }else{
        last = pWInfo->iEndWhere;
      }
      if( pIdx->bHasExpr ){
        IndexedExpr *p = pParse->pIdxEpr;
        while( p ){
          if( p->iIdxCur==pLevel->iIdxCur ){
#ifdef WHERETRACE_ENABLED
            if( sqlite3WhereTrace & 0x200 ){
              sqlite3DebugPrintf("Disable pParse->pIdxEpr term {%d,%d}\n",
                                  p->iIdxCur, p->iIdxCol);
              if( sqlite3WhereTrace & 0x5000 ) sqlite3ShowExpr(p->pExpr);
            }
#endif
            p->iDataCur = -1;
            p->iIdxCur = -1;
          }
          p = p->pIENext;
        }
      }
      k = pLevel->addrBody + 1;
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ){
        printf("TRANSLATE cursor %d->%d in opcode range %d..%d\n",
                pLevel->iTabCur, pLevel->iIdxCur, k, last-1);
      }
      /* Proof that the "+1" on the k value above is safe */
      pOp = sqlite3VdbeGetOp(v, k - 1);
      assert( pOp->opcode!=OP_Column || pOp->p1!=pLevel->iTabCur );
      assert( pOp->opcode!=OP_Rowid  || pOp->p1!=pLevel->iTabCur );
      assert( pOp->opcode!=OP_IfNullRow || pOp->p1!=pLevel->iTabCur );
#endif
      pOp = sqlite3VdbeGetOp(v, k);
      pLastOp = pOp + (last - k);
      assert( pOp<=pLastOp );
      do{
        if( pOp->p1!=pLevel->iTabCur ){
          /* no-op */
        }else if( pOp->opcode==OP_Column
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
         || pOp->opcode==OP_Offset
#endif
        ){
          int x = pOp->p2;
          assert( pIdx->pTable==pTab );
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
          if( pOp->opcode==OP_Offset ){
            /* Do not need to translate the column number */
          }else
#endif
          if( !HasRowid(pTab) ){
            Index *pPk = sqlite3PrimaryKeyIndex(pTab);
            x = pPk->aiColumn[x];
            assert( x>=0 );
          }else{
            testcase( x!=sqlite3StorageColumnToTable(pTab,x) );
            x = sqlite3StorageColumnToTable(pTab,x);
          }
          x = sqlite3TableColumnToIndex(pIdx, x);
          if( x>=0 ){
            pOp->p2 = x;
            pOp->p1 = pLevel->iIdxCur;
            OpcodeRewriteTrace(db, k, pOp);
          }else if( pLoop->wsFlags & (WHERE_IDX_ONLY|WHERE_EXPRIDX) ){
            if( pLoop->wsFlags & WHERE_IDX_ONLY ){
              /* An error. pLoop is supposed to be a covering index loop,
              ** and yet the VM code refers to a column of the table that
              ** is not part of the index.  */
              sqlite3ErrorMsg(pParse, "internal query planner error");
              pParse->rc = SQLITE_INTERNAL;
            }else{
              /* The WHERE_EXPRIDX flag is set by the planner when it is likely
              ** that pLoop is a covering index loop, but it is not possible
              ** to be 100% sure. In this case, any OP_Explain opcode
              ** corresponding to this loop describes the index as a "COVERING
              ** INDEX". But, pOp proves that pLoop is not actually a covering
              ** index loop. So clear the WHERE_EXPRIDX flag and rewrite the
              ** text that accompanies the OP_Explain opcode, if any.  */
              pLoop->wsFlags &= ~WHERE_EXPRIDX;
              sqlite3WhereAddExplainText(pParse,
                  pLevel->addrBody-1,
                  pTabList,
                  pLevel,
                  pWInfo->wctrlFlags
              );
            }
          }
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
          OpcodeRewriteTrace(db, k, pOp);
        }else if( pOp->opcode==OP_IfNullRow ){
          pOp->p1 = pLevel->iIdxCur;
          OpcodeRewriteTrace(db, k, pOp);
        }
#ifdef SQLITE_DEBUG
        k++;
#endif
      }while( (++pOp)<pLastOp );
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ) printf("TRANSLATE complete\n");
#endif
    }
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  pParse->withinRJSubrtn -= nRJ;
  return;
}